

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O2

void non_empty_closedir_cb(uv_fs_t *req)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (req == &closedir_req) {
    if (closedir_req.result == 0) {
      uv_fs_req_cleanup(&closedir_req);
      non_empty_closedir_cb_count = non_empty_closedir_cb_count + 1;
      return;
    }
    pcVar2 = "req->result == 0";
    uVar1 = 0x115;
  }
  else {
    pcVar2 = "req == &closedir_req";
    uVar1 = 0x114;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
          ,uVar1,pcVar2);
  abort();
}

Assistant:

static void non_empty_closedir_cb(uv_fs_t* req) {
  ASSERT(req == &closedir_req);
  ASSERT(req->result == 0);
  uv_fs_req_cleanup(req);
  ++non_empty_closedir_cb_count;
}